

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall
JobQueue::setupJobStealing
          (JobQueue *this,cbtAlignedObjectArray<JobQueue> *contextArray,int numActiveContexts)

{
  cbtAlignedObjectArray<JobQueue_*> *this_00;
  uint uVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  int i;
  int iVar6;
  JobQueue *local_38;
  
  uVar1 = contextArray->m_size;
  iVar6 = 0;
  lVar5 = 0;
  uVar2 = 0;
  do {
    if ((~((int)uVar1 >> 0x1f) & uVar1) == uVar2) {
LAB_00e1b8e2:
      uVar4 = 3;
      if ((int)uVar1 < 3) {
        uVar4 = uVar1;
      }
      this_00 = &this->m_neighborContexts;
      cbtAlignedObjectArray<JobQueue_*>::reserve(this_00,uVar4 - 1);
      uVar2 = 0;
      cbtAlignedObjectArray<JobQueue_*>::resizeNoInitialize(this_00,0);
      piVar3 = &DAT_00f60640;
      while ((uVar2 < 6 && ((this->m_neighborContexts).m_size < (int)(uVar4 - 1)))) {
        uVar1 = *piVar3 + iVar6;
        if ((int)uVar1 < numActiveContexts && -1 < (int)uVar1) {
          local_38 = contextArray->m_data + uVar1;
          cbtAlignedObjectArray<JobQueue_*>::push_back(this_00,&local_38);
        }
        uVar2 = uVar2 + 1;
        piVar3 = piVar3 + 1;
      }
      return;
    }
    if ((JobQueue *)(contextArray->m_data->m_cachePadding + lVar5 + -0x78) == this) {
      iVar6 = (int)uVar2;
      goto LAB_00e1b8e2;
    }
    uVar2 = uVar2 + 1;
    lVar5 = lVar5 + 0xb8;
  } while( true );
}

Assistant:

void setupJobStealing(cbtAlignedObjectArray<JobQueue> * contextArray, int numActiveContexts)
	{
		cbtAlignedObjectArray<JobQueue>& contexts = *contextArray;
		int selfIndex = 0;
		for (int i = 0; i < contexts.size(); ++i)
		{
			if (this == &contexts[i])
			{
				selfIndex = i;
				break;
			}
		}
		int numNeighbors = cbtMin(2, contexts.size() - 1);
		int neighborOffsets[] = {-1, 1, -2, 2, -3, 3};
		int numOffsets = sizeof(neighborOffsets) / sizeof(neighborOffsets[0]);
		m_neighborContexts.reserve(numNeighbors);
		m_neighborContexts.resizeNoInitialize(0);
		for (int i = 0; i < numOffsets && m_neighborContexts.size() < numNeighbors; i++)
		{
			int neighborIndex = selfIndex + neighborOffsets[i];
			if (neighborIndex >= 0 && neighborIndex < numActiveContexts)
			{
				m_neighborContexts.push_back(&contexts[neighborIndex]);
			}
		}
	}